

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

uint32_t index_alpha(argon2_instance_t *instance,argon2_position_t *position,uint32_t pseudo_rand,
                    int same_lane)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  if (position->pass == 0) {
    if (position->slice == 0) {
      uVar2 = position->index - 1;
    }
    else {
      iVar3 = (uint)position->slice * instance->segment_length;
      if (same_lane == 0) {
        uVar2 = iVar3 - (uint)(position->index == 0);
      }
      else {
        uVar2 = (iVar3 + position->index) - 1;
      }
    }
  }
  else {
    uVar1 = instance->segment_length;
    if (same_lane == 0) {
      uVar2 = (instance->lane_length - uVar1) - (uint)(position->index == 0);
    }
    else {
      uVar2 = instance->lane_length + ~uVar1 + position->index;
    }
    if (position->slice != 3) {
      uVar4 = (ulong)(uVar1 * (position->slice + 1));
      goto LAB_00102e38;
    }
  }
  uVar4 = 0;
LAB_00102e38:
  return (uint32_t)
         ((((uVar2 - 1) + uVar4) -
          ((ulong)uVar2 * ((ulong)pseudo_rand * (ulong)pseudo_rand >> 0x20) >> 0x20)) %
         (ulong)instance->lane_length);
}

Assistant:

uint32_t index_alpha(const argon2_instance_t *instance,
                     const argon2_position_t *position, uint32_t pseudo_rand,
                     int same_lane) {
    /*
     * Pass 0:
     *      This lane : all already finished segments plus already constructed
     * blocks in this segment
     *      Other lanes : all already finished segments
     * Pass 1+:
     *      This lane : (SYNC_POINTS - 1) last segments plus already constructed
     * blocks in this segment
     *      Other lanes : (SYNC_POINTS - 1) last segments
     */
    uint32_t reference_area_size;
    uint64_t relative_position;
    uint32_t start_position, absolute_position;

    if (0 == position->pass) {
        /* First pass */
        if (0 == position->slice) {
            /* First slice */
            reference_area_size =
                position->index - 1; /* all but the previous */
        } else {
            if (same_lane) {
                /* The same lane => add current segment */
                reference_area_size =
                    position->slice * instance->segment_length +
                    position->index - 1;
            } else {
                reference_area_size =
                    position->slice * instance->segment_length +
                    ((position->index == 0) ? (-1) : 0);
            }
        }
    } else {
        /* Second pass */
        if (same_lane) {
            reference_area_size = instance->lane_length -
                                  instance->segment_length + position->index -
                                  1;
        } else {
            reference_area_size = instance->lane_length -
                                  instance->segment_length +
                                  ((position->index == 0) ? (-1) : 0);
        }
    }

    /* 1.2.4. Mapping pseudo_rand to 0..<reference_area_size-1> and produce
     * relative position */
    relative_position = pseudo_rand;
    relative_position = relative_position * relative_position >> 32;
    relative_position = reference_area_size - 1 -
                        (reference_area_size * relative_position >> 32);

    /* 1.2.5 Computing starting position */
    start_position = 0;

    if (0 != position->pass) {
        start_position = (position->slice == ARGON2_SYNC_POINTS - 1)
                             ? 0
                             : (position->slice + 1) * instance->segment_length;
    }

    /* 1.2.6. Computing absolute position */
    absolute_position = (start_position + relative_position) %
                        instance->lane_length; /* absolute position */
    return absolute_position;
}